

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O3

void __thiscall
xray_re::xr_mesh_vbuf::transform_normals
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  lVar4 = 0xe;
  do {
    uVar1 = *(undefined8 *)((long)&xform->field_0 + lVar4 * 4);
    dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
    auVar5._8_4_ = SUB84(dVar2,0);
    auVar5._0_8_ = (double)(float)uVar1;
    auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
    *(undefined1 (*) [16])(local_88 + lVar4 * 8) = auVar5;
    lVar4 = lVar4 + -2;
  } while (lVar4 != -2);
  if (size != 0) {
    auVar6._0_8_ = SQRT(local_78 * local_78 +
                        local_88._0_8_ * local_88._0_8_ + local_88._8_8_ * local_88._8_8_);
    auVar6._8_8_ = auVar6._0_8_;
    auVar5 = divpd(local_88,auVar6);
    auVar8._0_8_ = SQRT(local_58 * local_58 +
                        local_68._0_8_ * local_68._0_8_ + local_68._8_8_ * local_68._8_8_);
    auVar8._8_8_ = auVar8._0_8_;
    auVar7 = divpd(local_68,auVar8);
    dVar2 = SQRT(local_38 * local_38 +
                 local_48._0_8_ * local_48._0_8_ + local_48._8_8_ * local_48._8_8_);
    auVar9._8_4_ = SUB84(dVar2,0);
    auVar9._0_8_ = dVar2;
    auVar9._12_4_ = (int)((ulong)dVar2 >> 0x20);
    auVar9 = divpd(local_48,auVar9);
    lVar4 = 0;
    do {
      dVar3 = (double)*(float *)((long)&source->field_0 + lVar4);
      dVar10 = (double)*(float *)((long)&source->field_0 + lVar4 + 4);
      dVar11 = (double)*(float *)((long)&source->field_0 + lVar4 + 8);
      *(ulong *)((long)&target->field_0 + lVar4) =
           CONCAT44((float)(dVar11 * auVar9._8_8_ + dVar3 * auVar5._8_8_ + dVar10 * auVar7._8_8_),
                    (float)(dVar11 * auVar9._0_8_ + dVar3 * auVar5._0_8_ + dVar10 * auVar7._0_8_));
      *(float *)((long)&target->field_0 + lVar4 + 8) =
           (float)((local_38 / dVar2) * dVar11 +
                  (local_78 / auVar6._0_8_) * dVar3 + (local_58 / auVar8._0_8_) * dVar10);
      lVar4 = lVar4 + 0xc;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_normals(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	m.i.normalize();
	m.j.normalize();
	m.k.normalize();
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).rotate(m));
}